

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURL * curl_easy_init(void)

{
  atomic_int aVar1;
  CURLcode CVar2;
  CURL *in_RAX;
  _Bool in_SIL;
  Curl_easy *data;
  CURL *local_8;
  
  aVar1 = s_lock;
  LOCK();
  s_lock = 1;
  UNLOCK();
  if (aVar1 != 0) {
    do {
    } while( true );
  }
  local_8 = in_RAX;
  if ((initialized == 0) && (CVar2 = global_init(1,in_SIL), CVar2 != CURLE_OK)) {
    s_lock = 0;
  }
  else {
    s_lock = 0;
    CVar2 = Curl_open(&local_8);
    if (CVar2 == CURLE_OK) {
      return local_8;
    }
  }
  return (CURL *)0x0;
}

Assistant:

struct Curl_easy *curl_easy_init(void)
{
  CURLcode result;
  struct Curl_easy *data;

  /* Make sure we inited the global SSL stuff */
  global_init_lock();

  if(!initialized) {
    result = global_init(CURL_GLOBAL_DEFAULT, TRUE);
    if(result) {
      /* something in the global init failed, return nothing */
      DEBUGF(fprintf(stderr, "Error: curl_global_init failed\n"));
      global_init_unlock();
      return NULL;
    }
  }
  global_init_unlock();

  /* We use curl_open() with undefined URL so far */
  result = Curl_open(&data);
  if(result) {
    DEBUGF(fprintf(stderr, "Error: Curl_open failed\n"));
    return NULL;
  }

  return data;
}